

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O2

void __thiscall FUnzip::exec(FUnzip *this)

{
  thread *__t;
  path *this_00;
  uint32_t *__return_storage_ptr__;
  string *this_01;
  string *__lhs;
  undefined8 uVar1;
  undefined8 uVar2;
  pointer piVar3;
  bool bVar4;
  undefined8 *puVar5;
  int iVar6;
  pointer ptVar7;
  int *gid_00;
  _Alloc_hider _Var8;
  undefined1 auVar9 [8];
  iterator __begin2;
  undefined1 auVar10 [8];
  int gid_01;
  int iVar11;
  undefined1 uVar12;
  int64_t *uncompSize_00;
  pointer __rhs;
  undefined8 uStack_10248;
  char linkName [65536];
  undefined1 local_208 [8];
  string dname;
  mutex lm;
  undefined1 local_1b8 [8];
  ZipStream zs;
  string fname;
  LocalEntry le;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  undefined1 local_c0 [8];
  vector<std::thread,_std::allocator<std::thread>_> workerThreads;
  vector<int,_std::allocator<int>_> links;
  undefined1 auStack_88 [8];
  vector<int,_std::allocator<int>_> dirs;
  ulong uStack_68;
  atomic<int> entryNum;
  int64_t uncompSize;
  undefined1 local_58 [8];
  File f;
  int local_38 [2];
  int uid;
  int gid;
  
  dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  ZipStream::ZipStream((ZipStream *)local_1b8,&this->zipName);
  if (zs.f_._vptr_File == (_func_int **)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = &PTR__exception_00150a38;
    puVar5[1] = "Not a zip file";
    __cxa_throw(puVar5,&funzip_exception::typeinfo,std::exception::~exception);
  }
  if ((undefined1  [8])
      zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
      super__Vector_impl_data._M_start != local_1b8) {
    auVar9 = local_1b8;
    if (this->listFiles == true) {
      for (; auVar9 != (undefined1  [8])
                       zs.entries_.
                       super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          auVar9 = (undefined1  [8])((long)auVar9 + 0x38)) {
        puts((((pointer)auVar9)->name)._M_dataplus._M_p);
      }
    }
    else {
      __lhs = &this->destinationDir;
      bVar4 = std::operator==(__lhs,"");
      if (bVar4) {
        smartDestDir(this,(ZipStream *)local_1b8);
      }
      bVar4 = std::operator!=(__lhs,"");
      if ((bVar4) &&
         ((this->destinationDir)._M_dataplus._M_p[(this->destinationDir)._M_string_length - 1] !=
          '/')) {
        std::__cxx11::string::append((char *)__lhs);
      }
      dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      dname.field_2._8_8_ = 0;
      f.fp_ = (FILE *)this;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_c0,
                 (long)this->threadCount,(allocator_type *)&uStack_10248);
      ptVar7 = workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __t = (thread *)(linkName + 0xfff8);
      for (auVar9 = local_c0; auVar10 = local_c0, auVar9 != (undefined1  [8])ptVar7;
          auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
        linkName._0_8_ =
             (long)&dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 4;
        linkName._8_8_ = (long)&dname.field_2 + 8;
        linkName._16_8_ =
             &workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        linkName._24_8_ = auStack_88;
        uStack_10248 = (ZipStream *)local_1b8;
        ZipStream::dupFile((ZipStream *)(linkName + 0x20));
        linkName[0x30] = *(char *)(f.fp_ + 0x25);
        std::__cxx11::string::string((string *)(linkName + 0x38),(string *)__lhs);
        linkName[0xfff8] = '\0';
        linkName[0xfff9] = '\0';
        linkName[0xfffa] = '\0';
        linkName[0xfffb] = '\0';
        linkName[0xfffc] = '\0';
        linkName[0xfffd] = '\0';
        linkName[0xfffe] = '\0';
        linkName[0xffff] = '\0';
        le._22_8_ = operator_new(0x68);
        uVar2 = linkName._64_8_;
        uVar1 = linkName._40_8_;
        *(undefined ***)le._22_8_ = &PTR___State_impl_00150a60;
        *(undefined4 *)(le._22_8_ + 8) = (undefined4)uStack_10248;
        *(undefined4 *)(le._22_8_ + 0xc) = uStack_10248._4_4_;
        *(undefined4 *)(le._22_8_ + 0x10) = linkName._0_4_;
        *(undefined4 *)(le._22_8_ + 0x14) = linkName._4_4_;
        *(undefined4 *)(le._22_8_ + 0x18) = linkName._8_4_;
        *(undefined4 *)(le._22_8_ + 0x1c) = linkName._12_4_;
        *(undefined4 *)(le._22_8_ + 0x20) = linkName._16_4_;
        *(undefined4 *)(le._22_8_ + 0x24) = linkName._20_4_;
        *(undefined8 *)(le._22_8_ + 0x28) = linkName._24_8_;
        *(undefined ***)(le._22_8_ + 0x30) = &PTR__File_001508f0;
        linkName[0x28] = '\0';
        linkName[0x29] = '\0';
        linkName[0x2a] = '\0';
        linkName[0x2b] = '\0';
        linkName[0x2c] = '\0';
        linkName[0x2d] = '\0';
        linkName[0x2e] = '\0';
        linkName[0x2f] = '\0';
        *(undefined8 *)(le._22_8_ + 0x38) = uVar1;
        *(char *)(le._22_8_ + 0x40) = linkName[0x30];
        *(char **)(le._22_8_ + 0x48) = (char *)(le._22_8_ + 0x58);
        if ((char *)linkName._56_8_ == linkName + 0x48) {
          *(undefined4 *)(le._22_8_ + 0x58) = linkName._72_4_;
          *(undefined4 *)(le._22_8_ + 0x5c) = linkName._76_4_;
          *(undefined4 *)(le._22_8_ + 0x60) = linkName._80_4_;
          *(undefined4 *)(le._22_8_ + 100) = linkName._84_4_;
        }
        else {
          *(undefined8 *)(le._22_8_ + 0x48) = linkName._56_8_;
          *(ulong *)(le._22_8_ + 0x58) = CONCAT44(linkName._76_4_,linkName._72_4_);
        }
        linkName[0x40] = '\0';
        linkName[0x41] = '\0';
        linkName[0x42] = '\0';
        linkName[0x43] = '\0';
        linkName[0x44] = '\0';
        linkName[0x45] = '\0';
        linkName[0x46] = '\0';
        linkName[0x47] = '\0';
        *(undefined8 *)(le._22_8_ + 0x50) = uVar2;
        linkName._72_4_ = linkName._72_4_ & 0xffffff00;
        linkName._56_8_ = linkName + 0x48;
        std::thread::_M_start_thread(__t,&le.uncompSize,0);
        if (le._22_8_ != 0) {
          (**(code **)(*(long *)le._22_8_ + 8))();
        }
        std::thread::operator=((thread *)auVar9,__t);
        std::thread::~thread(__t);
        exec()::$_0::~__0((__0 *)&uStack_10248);
      }
      for (; auVar10 !=
             (undefined1  [8])
             workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start; auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
        std::thread::join();
      }
      ZipStream::dupFile((ZipStream *)local_58);
      name.field_2._8_8_ = 0;
      for (ptVar7 = workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          piVar3 = dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start, auVar9 = local_1b8,
          ptVar7 != (pointer)name.field_2._8_8_;
          ptVar7 = (pointer)((long)&(ptVar7->_M_id)._M_thread + 4)) {
        iVar11 = (int)(ptVar7->_M_id)._M_thread;
        fseek((FILE *)f._vptr_File,((pointer)((long)local_1b8 + (long)iVar11 * 0x38))->offset,0);
        File::Read<LocalEntry>((LocalEntry *)((long)&fname.field_2 + 10),(File *)local_58);
        fseek((FILE *)f._vptr_File,(ulong)(ushort)le.compSize,1);
        local_38[1] = 0xffffffff;
        local_38[0] = -1;
        uStack_68 = (ulong)le.crc;
        gid_00 = local_38 + 1;
        gid_01 = 0;
        uncompSize_00 = (int64_t *)&stack0xffffffffffffff98;
        readExtra((File *)local_58,(uint)le.compSize._2_2_,local_38,gid_00,(int64_t *)0x0,
                  uncompSize_00);
        uVar12 = SUB81(uncompSize_00,0);
        iVar6 = (int)gid_00;
        File::Read<char>((File *)local_58,(char *)&uStack_10248,uStack_68);
        __rhs = (pointer)((long)auVar9 + (long)iVar11 * 0x38);
        linkName[uStack_68 - 8] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
        path_directory((string *)local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
        path_filename((string *)&zs.f_.fp_,(string *)__rhs);
        if (f.fp_[0x25] == (FILE)0x1) {
          iVar6 = (int)&uStack_10248;
          printf("Link %s/%s -> %s\n",local_208,zs.f_.fp_);
        }
        std::experimental::filesystem::v1::__cxx11::path::
        path<char[65536],std::experimental::filesystem::v1::__cxx11::path>
                  ((path *)&le.uncompSize,(char (*) [65536])&uStack_10248);
        this_00 = (path *)(linkName + 0xfff8);
        std::experimental::filesystem::v1::__cxx11::path::
        path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &zs.f_.fp_);
        std::experimental::filesystem::v1::create_symlink((path *)&le.uncompSize,this_00);
        std::experimental::filesystem::v1::__cxx11::path::~path(this_00);
        std::experimental::filesystem::v1::__cxx11::path::~path((path *)&le.uncompSize);
        setMeta((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                __rhs->flags,le._2_4_,iVar6,gid_01,(bool)uVar12);
        std::__cxx11::string::~string((string *)&zs.f_.fp_);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::string::~string((string *)local_e8);
      }
      __return_storage_ptr__ = &le.uncompSize;
      this_01 = (string *)(linkName + 0xfff8);
      auVar9 = auStack_88;
      while (auVar10 = local_1b8, auVar9 != (undefined1  [8])piVar3) {
        iVar6 = *(int *)auVar9;
        f.fp_ = (FILE *)auVar9;
        fseek((FILE *)f._vptr_File,((pointer)((long)local_1b8 + (long)iVar6 * 0x38))->offset,0);
        File::Read<LocalEntry>((LocalEntry *)local_e8,(File *)local_58);
        fseek((FILE *)f._vptr_File,(ulong)(ushort)name.field_2._M_allocated_capacity._2_2_,1);
        local_38[1] = 0xffffffff;
        local_38[0] = -1;
        iVar11 = 0;
        uVar12 = 0;
        readExtra((File *)local_58,(uint)(ushort)name.field_2._M_allocated_capacity._4_2_,local_38,
                  local_38 + 1,(int64_t *)0x0,(int64_t *)0x0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)auVar10 + (long)iVar6 * 0x38));
        _Var8._M_p = name_1._M_dataplus._M_p;
        if (name_1._M_dataplus._M_p[le._22_8_ + -1] == '/') {
          _Var8._M_p = name_1._M_dataplus._M_p + -1;
          std::__cxx11::string::substr((ulong)this_01,(ulong)__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,this_01);
          std::__cxx11::string::~string(this_01);
        }
        setMeta((string *)__return_storage_ptr__,
                ((pointer)((long)auVar10 + (long)iVar6 * 0x38))->flags,name._M_dataplus._M_p._2_4_,
                (int)_Var8._M_p,iVar11,(bool)uVar12);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        auVar9 = (undefined1  [8])(f.fp_ + 4);
      }
      if (zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        puts((char *)zs.entries_.
                     super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
      }
      File::~File((File *)local_58);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_c0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)auStack_88);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  ZipStream::~ZipStream((ZipStream *)local_1b8);
  return;
}

Assistant:

void FUnzip::exec()
{
    std::atomic<int> entryNum(0);
    ZipStream zs{zipName};
    if (!zs.valid())
        throw funzip_exception("Not a zip file");

    if (zs.size() == 0)
        return;

    if (listFiles) {
        for (auto const& e : zs) {
            printf("%s\n", e.name.c_str());
        }
        return;
    }

    if (destinationDir == "")
        smartDestDir(zs);
    if (destinationDir != "" &&
        destinationDir[destinationDir.size() - 1] != '/')
        destinationDir += "/";

    std::vector<int> links;
    std::vector<int> dirs;
    std::mutex lm;

    std::vector<std::thread> workerThreads(threadCount);

    for (auto& t : workerThreads) {
        t = std::thread([&zs, &entryNum, &lm, &links, &dirs, f = zs.dupFile(),
                         verbose = verbose,
                         destDir = destinationDir]() mutable {
            while (true) {
                unsigned en = entryNum++;
                if (en >= zs.size())
                    break;
                auto& e = zs.getEntry(en);
                if ((e.flags & S_IFLNK) == S_IFLNK) {
                    std::lock_guard<std::mutex> lock(lm);
                    links.push_back(en);
                    continue;
                }

                if ((e.flags & S_IFDIR) == S_IFDIR ||
                    e.name[e.name.length() - 1] == '/') {
                    std::lock_guard<std::mutex> lock(lm);
                    dirs.push_back(en);
                    if (!fileExists(e.name))
                        makedirs(e.name);
                    continue;
                }

                f.seek(e.offset);
                auto le = f.Read<LocalEntry>();

                f.seek(le.nameLen, SEEK_CUR);
                int gid = -1;
                int uid = -1;
                int64_t uncompSize = le.uncompSize;
                int64_t compSize = le.compSize;
                // Read extra fields
                readExtra(f, le.exLen, &uid, &gid, &compSize, &uncompSize);
                auto name = destDir + e.name;
                auto dname = path_directory(name);
                if (dname != "" && !fileExists(dname))
                    makedirs(dname);

                if (verbose) {
                    printf("%s\n", name.c_str());
                    fflush(stdout);
                }
                // printf("%s %x %s %s\n", fileName, a, (a & S_IFDIR)  ==
                // S_IFDIR ? "DIR" : "", (a & S_IFLNK) == S_IFLNK ? "LINK" :
                // "");

                auto fout = File{name, File::Mode::WRITE};
                if (!fout.canWrite()) {
                    // char errstr[128];
                    // strerror_r(errno, errstr, sizeof(errstr));
                    // fprintf(stderr, "**Warning: Could not write '%s' (%s)\n",
                    // name.c_str(), errstr);
                    continue;
                }
                if (le.method == 0)
                    copyfile(fout, uncompSize, f);
                else
                    uncompress(fout, compSize, f);
                fout.close();
                setMeta(name, e.flags, le.dateTime, uid, gid);
            }
        });
    }
    for (auto& t : workerThreads)
        t.join();

    char linkName[65536];
    int uid, gid;
    auto f = zs.dupFile();
    for (int i : links) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        int64_t uncompSize = le.uncompSize;
        readExtra(f, le.exLen, &uid, &gid, nullptr, &uncompSize);
        f.Read(linkName, uncompSize);
        linkName[uncompSize] = 0;
        auto name = destinationDir + e.name;
        auto dname = path_directory(name);
        auto fname = path_filename(e.name);
        // int fd = open(dname.c_str(), 0);
        if (verbose)
            printf("Link %s/%s -> %s\n", dname.c_str(), fname.c_str(),
                   linkName);
        fs::create_symlink(linkName, fname);
        // symlinkat(linkName, fd, fname.c_str());
        // close(fd);
        setMeta(name, e.flags, le.dateTime, uid, gid, true);
    }
    for (int i : dirs) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        readExtra(f, le.exLen, &uid, &gid);
        auto name = destinationDir + e.name;
        auto l = name.length();
        if (name[l - 1] == '/')
            name = name.substr(0, l - 1);
        setMeta(name, e.flags, le.dateTime, uid, gid);
    }

    if (zs.comment())
        puts(zs.comment());
}